

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcMux.c
# Opt level: O3

Lpk_Fun_t * Lpk_MuxSplit(Lpk_Man_t *pMan,Lpk_Fun_t *p,int Var,int Pol)

{
  Lpk_Fun_t *pIn;
  Lpk_Fun_t *pOut;
  uint uVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  Lpk_Fun_t *pLVar4;
  byte bVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  Lpk_Fun_t *pLVar9;
  long lVar10;
  uint uVar11;
  Lpk_Fun_t *pOut_00;
  uint uVar12;
  int iVar15;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar19;
  
  uVar3 = *(uint *)&p->field_0x8 >> 7 & 0x1f;
  bVar5 = (sbyte)uVar3 - 5;
  if (uVar3 < 6) {
    bVar5 = 0;
  }
  if ((Var < 0) || (uVar3 <= (uint)Var)) {
    __assert_fail("Var >= 0 && Var < (int)p->nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkAbcMux.c"
                  ,0xac,"Lpk_Fun_t *Lpk_MuxSplit(Lpk_Man_t *, Lpk_Fun_t *, int, int)");
  }
  if ((*(uint *)&p->field_0x8 & 0x1e0000) == 0) {
    __assert_fail("p->nAreaLim >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkAbcMux.c"
                  ,0xad,"Lpk_Fun_t *Lpk_MuxSplit(Lpk_Man_t *, Lpk_Fun_t *, int, int)");
  }
  if ((-1 << (sbyte)uVar3 ^ p->uSupp) != 0xffffffff) {
    __assert_fail("p->uSupp == Kit_BitMask(p->nVars)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkAbcMux.c"
                  ,0xae,"Lpk_Fun_t *Lpk_MuxSplit(Lpk_Man_t *, Lpk_Fun_t *, int, int)");
  }
  pIn = p + 1;
  pOut_00 = (Lpk_Fun_t *)(p[1].puSupps + ((ulong)(uint)(1 << (bVar5 & 0x1f)) - 4));
  pOut = (Lpk_Fun_t *)(p[1].puSupps + ((ulong)(uint)(2 << (bVar5 & 0x1f)) - 4));
  Kit_TruthCofactor0New((uint *)pOut_00,(uint *)pIn,uVar3,Var);
  Kit_TruthCofactor1New((uint *)pOut,(uint *)pIn,*(uint *)&p->field_0x8 >> 7 & 0x1f,Var);
  pLVar9 = pOut;
  pLVar4 = pOut_00;
  if (Pol == 0) {
    pLVar9 = pOut_00;
    pLVar4 = pOut;
  }
  pLVar4 = Lpk_FunDup(p,(uint *)pLVar4);
  uVar3 = Kit_TruthSupport((uint *)pLVar9,*(uint *)&p->field_0x8 >> 7 & 0x1f);
  uVar3 = uVar3 | 1 << (Var & 0x1fU);
  p->uSupp = uVar3;
  uVar6 = 0;
  do {
    if ((uVar3 >> (uVar6 & 0x1f) & 1) == 0) {
      uVar12 = *(uint *)&p->field_0x8 >> 7 & 0x1f;
      if (uVar12 <= uVar6) {
        __assert_fail("iVarVac < (int)p->nVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkAbcMux.c"
                      ,0xc0,"Lpk_Fun_t *Lpk_MuxSplit(Lpk_Man_t *, Lpk_Fun_t *, int, int)");
      }
      goto LAB_004725ae;
    }
    uVar6 = uVar6 + 1;
  } while (uVar6 != 0x20);
  uVar12 = *(uint *)&p->field_0x8 >> 7 & 0x1f;
  uVar6 = 0xffffffff;
LAB_004725ae:
  p->uSupp = uVar3 | 1 << (uVar6 & 0x1f);
  auVar2 = _DAT_007ee2e0;
  uVar3 = 1 << ((char)uVar12 - 5U & 0x1f);
  if (uVar12 < 6) {
    uVar3 = 1;
  }
  lVar10 = (long)(int)uVar6;
  if ((int)uVar6 < 5) {
    uVar6 = *(uint *)(&DAT_00885430 + lVar10 * 4);
    lVar7 = (ulong)uVar3 - 1;
    auVar13._8_4_ = (int)lVar7;
    auVar13._0_8_ = lVar7;
    auVar13._12_4_ = (int)((ulong)lVar7 >> 0x20);
    uVar8 = 0;
    auVar13 = auVar13 ^ _DAT_007ee2e0;
    auVar17 = _DAT_007ee2c0;
    auVar16 = _DAT_007ee2d0;
    do {
      auVar18 = auVar16 ^ auVar2;
      iVar15 = auVar13._4_4_;
      if ((bool)(~(auVar18._4_4_ == iVar15 && auVar13._0_4_ < auVar18._0_4_ ||
                  iVar15 < auVar18._4_4_) & 1)) {
        p[1].puSupps[uVar8 - 4] = uVar6;
      }
      if ((auVar18._12_4_ != auVar13._12_4_ || auVar18._8_4_ <= auVar13._8_4_) &&
          auVar18._12_4_ <= auVar13._12_4_) {
        p[1].puSupps[uVar8 - 3] = uVar6;
      }
      iVar19 = SUB164(auVar17 ^ auVar2,4);
      if (iVar19 <= iVar15 && (iVar19 != iVar15 || SUB164(auVar17 ^ auVar2,0) <= auVar13._0_4_)) {
        p[1].puSupps[uVar8 - 2] = uVar6;
        p[1].puSupps[uVar8 - 1] = uVar6;
      }
      uVar8 = uVar8 + 4;
      lVar7 = auVar16._8_8_;
      auVar16._0_8_ = auVar16._0_8_ + 4;
      auVar16._8_8_ = lVar7 + 4;
      lVar7 = auVar17._8_8_;
      auVar17._0_8_ = auVar17._0_8_ + 4;
      auVar17._8_8_ = lVar7 + 4;
    } while ((uVar3 + 3 & 0xfffffffc) != uVar8);
  }
  else {
    uVar6 = 1 << ((char)uVar6 - 5U & 0x1f);
    lVar7 = (ulong)uVar3 - 1;
    auVar14._8_4_ = (int)lVar7;
    auVar14._0_8_ = lVar7;
    auVar14._12_4_ = (int)((ulong)lVar7 >> 0x20);
    uVar8 = 0;
    auVar14 = auVar14 ^ _DAT_007ee2e0;
    auVar18 = _DAT_007ee2d0;
    do {
      auVar17 = auVar18 ^ auVar2;
      if ((bool)(~(auVar17._4_4_ == auVar14._4_4_ && auVar14._0_4_ < auVar17._0_4_ ||
                  auVar14._4_4_ < auVar17._4_4_) & 1)) {
        p[1].puSupps[uVar8 - 4] = -(uint)((uVar6 & (uint)uVar8) != 0);
      }
      if ((auVar17._12_4_ != auVar14._12_4_ || auVar17._8_4_ <= auVar14._8_4_) &&
          auVar17._12_4_ <= auVar14._12_4_) {
        p[1].puSupps[uVar8 - 3] = -(uint)(((uint)uVar8 + 1 & uVar6) != 0);
      }
      uVar8 = uVar8 + 2;
      lVar7 = auVar18._8_8_;
      auVar18._0_8_ = auVar18._0_8_ + 2;
      auVar18._8_8_ = lVar7 + 2;
    } while ((uVar3 + 1 & 0xfffffffe) != uVar8);
  }
  pLVar9 = pIn;
  if (Pol != 0) {
    pLVar9 = pOut;
    pOut_00 = pIn;
  }
  Kit_TruthMuxVar((uint *)pIn,(uint *)pOut_00,(uint *)pLVar9,uVar12,Var);
  uVar3 = p->uSupp;
  uVar6 = Kit_TruthSupport((uint *)pIn,*(uint *)&p->field_0x8 >> 7 & 0x1f);
  if (uVar3 == uVar6) {
    p->pFanins[lVar10] = pLVar4->field_0x8 & 0x7f;
    p->pDelays[lVar10] = (char)(*(uint *)&p->field_0x8 >> 0x15) + -1;
    p->field_0xb = p->field_0xb & 0xbf;
    Lpk_FunSuppMinimize(p);
    Lpk_FunSuppMinimize(pLVar4);
    uVar3 = *(uint *)&pLVar4->field_0x8;
    uVar6 = *(int *)&p->field_0x8 + 0x3fe00000U & 0x3fe00000;
    *(uint *)&pLVar4->field_0x8 = uVar3 & 0xc01fffff | uVar6;
    uVar12 = uVar3 >> 7 & 0x1f;
    if ((uVar3 >> 0xc & 0xf) < uVar12) {
      uVar1 = *(uint *)&p->field_0x8;
      uVar11 = uVar1 >> 7 & 0x1f;
      if ((uVar1 >> 0xc & 0xf) < uVar11) {
        if (uVar11 < uVar12) {
          *(uint *)&pLVar4->field_0x8 =
               uVar3 & 0xc000ffff | uVar6 | (uVar1 & 0x10000) + (uVar1 >> 1 & 0xf0000);
          uVar6 = *(uint *)&p->field_0x8;
          uVar3 = (((int)(uVar6 << 0xf) >> 0x1f) + (uVar6 >> 0x11 & 0xf) & 0x1f) << 0x10;
        }
        else {
          *(uint *)&pLVar4->field_0x8 =
               uVar3 & 0xc000ffff | uVar6 |
               (((int)(uVar1 << 0xf) >> 0x1f) + (uVar1 >> 0x11 & 0xf) & 0x1f) << 0x10;
          uVar6 = *(uint *)&p->field_0x8;
          uVar3 = (uVar6 & 0x10000) + (uVar6 >> 1 & 0xf0000);
        }
        uVar3 = uVar6 & 0xffe0ffff | uVar3;
      }
      else {
        *(uint *)&pLVar4->field_0x8 = uVar3 & 0xc000ffff | uVar6 | uVar1 + 0x1f0000 & 0x1f0000;
        uVar3 = *(uint *)&p->field_0x8 & 0xffe0ffff | 0x10000;
      }
    }
    else {
      *(uint *)&pLVar4->field_0x8 = uVar3 & 0xc000ffff | uVar6 | 0x10000;
      uVar3 = *(uint *)&p->field_0x8 & 0xffe0ffff | *(uint *)&p->field_0x8 + 0x1f0000 & 0x1f0000;
    }
    *(uint *)&p->field_0x8 = uVar3;
    pLVar4->field_0xb = pLVar4->field_0xb | 0x80;
    return pLVar4;
  }
  __assert_fail("p->uSupp == Kit_TruthSupport(pTruth, p->nVars)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkAbcMux.c"
                ,199,"Lpk_Fun_t *Lpk_MuxSplit(Lpk_Man_t *, Lpk_Fun_t *, int, int)");
}

Assistant:

Lpk_Fun_t * Lpk_MuxSplit( Lpk_Man_t * pMan, Lpk_Fun_t * p, int Var, int Pol )
{
    Lpk_Fun_t * pNew;
    unsigned * pTruth  = Lpk_FunTruth( p, 0 );
    unsigned * pTruth0 = Lpk_FunTruth( p, 1 );
    unsigned * pTruth1 = Lpk_FunTruth( p, 2 );
//    unsigned uSupp;
    int iVarVac; 
    assert( Var >= 0 && Var < (int)p->nVars );
    assert( p->nAreaLim >= 2 );
    assert( p->uSupp == Kit_BitMask(p->nVars) );
    Kit_TruthCofactor0New( pTruth0, pTruth, p->nVars, Var );
    Kit_TruthCofactor1New( pTruth1, pTruth, p->nVars, Var );
/*
uSupp = Kit_TruthSupport( pTruth, p->nVars );
Extra_PrintBinary( stdout, &uSupp, 16 ); printf( "\n" );
uSupp = Kit_TruthSupport( pTruth0, p->nVars );
Extra_PrintBinary( stdout, &uSupp, 16 ); printf( "\n" );
uSupp = Kit_TruthSupport( pTruth1, p->nVars );
Extra_PrintBinary( stdout, &uSupp, 16 ); printf( "\n\n" );
*/
    // derive the new component
    pNew = Lpk_FunDup( p, Pol ? pTruth0 : pTruth1 );
    // update the support of the old component
    p->uSupp  = Kit_TruthSupport( Pol ? pTruth1 : pTruth0, p->nVars );
    p->uSupp |= (1 << Var);
    // update the truth table of the old component
    iVarVac = Kit_WordFindFirstBit( ~p->uSupp );
    assert( iVarVac < (int)p->nVars );
    p->uSupp |= (1 << iVarVac);
    Kit_TruthIthVar( pTruth, p->nVars, iVarVac );
    if ( Pol )
        Kit_TruthMuxVar( pTruth, pTruth, pTruth1, p->nVars, Var );
    else
        Kit_TruthMuxVar( pTruth, pTruth0, pTruth, p->nVars, Var );
    assert( p->uSupp == Kit_TruthSupport(pTruth, p->nVars) );
    // set the decomposed variable
    p->pFanins[iVarVac] = pNew->Id;
    p->pDelays[iVarVac] = p->nDelayLim - 1;
    // support minimize both
    p->fSupports = 0;
    Lpk_FunSuppMinimize( p );
    Lpk_FunSuppMinimize( pNew );
    // update delay and area requirements
    pNew->nDelayLim = p->nDelayLim - 1;
    if ( pNew->nVars <= pNew->nLutK )
    {
        pNew->nAreaLim = 1;
        p->nAreaLim = p->nAreaLim - 1;
    }
    else if ( p->nVars <= p->nLutK )
    {
        pNew->nAreaLim = p->nAreaLim - 1;
        p->nAreaLim = 1;
    }
    else if ( p->nVars < pNew->nVars )
    {
        pNew->nAreaLim = p->nAreaLim / 2 + p->nAreaLim % 2;
        p->nAreaLim = p->nAreaLim / 2 - p->nAreaLim % 2;
    }
    else // if ( pNew->nVars < p->nVars )
    {
        pNew->nAreaLim = p->nAreaLim / 2 - p->nAreaLim % 2;
        p->nAreaLim = p->nAreaLim / 2 + p->nAreaLim % 2;
    }
    pNew->fMark = 1;
    return pNew;
}